

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O2

__pid_t __thiscall embree::LinearBarrierActive::wait(LinearBarrierActive *this,void *__stat_loc)

{
  size_t i;
  ulong uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  if (this->mode == 0) {
    if (__stat_loc == (void *)0x0) {
      for (uVar1 = 0; uVar1 < this->threadCount; uVar1 = uVar1 + 1) {
        this->count1[uVar1] = '\0';
      }
      for (uVar1 = 1; uVar1 < this->threadCount; uVar1 = uVar1 + 1) {
        while (lVar3 = 8, this->count0[uVar1] == '\0') {
          do {
            bVar4 = lVar3 != 0;
            lVar3 = lVar3 + -1;
          } while (bVar4);
        }
      }
      this->mode = 1;
      this->flag1 = 0;
      this->flag0 = 1;
      return 1;
    }
    this->count0[(long)__stat_loc] = '\x01';
    lVar3 = 8;
    while (lVar2 = lVar3, this->flag0 == 0) {
      do {
        bVar4 = lVar2 != 0;
        lVar2 = lVar2 + -1;
      } while (bVar4);
    }
  }
  else if (__stat_loc == (void *)0x0) {
    for (uVar1 = 0; uVar1 < this->threadCount; uVar1 = uVar1 + 1) {
      this->count0[uVar1] = '\0';
    }
    for (uVar1 = 1; uVar1 < this->threadCount; uVar1 = uVar1 + 1) {
      while (lVar3 = 8, this->count1[uVar1] == '\0') {
        do {
          bVar4 = lVar3 != 0;
          lVar3 = lVar3 + -1;
        } while (bVar4);
      }
    }
    lVar3 = 0;
    this->mode = 0;
    this->flag0 = 0;
    this->flag1 = 1;
  }
  else {
    this->count1[(long)__stat_loc] = '\x01';
    lVar3 = 8;
    while (lVar2 = lVar3, this->flag1 == 0) {
      do {
        bVar4 = lVar2 != 0;
        lVar2 = lVar2 + -1;
      } while (bVar4);
    }
  }
  return (__pid_t)lVar3;
}

Assistant:

void LinearBarrierActive::wait (const size_t threadIndex)
  {
    if (mode == 0)
    {			
      if (threadIndex == 0)
      {	
        for (size_t i=0; i<threadCount; i++)
          count1[i] = 0;
        
        for (size_t i=1; i<threadCount; i++)
        {
          while (likely(count0[i] == 0)) 
            pause_cpu();
        }
        mode  = 1;
        flag1 = 0;
        __memory_barrier();
        flag0 = 1;
      }			
      else
      {					
        count0[threadIndex] = 1;
        {
          while (likely(flag0 == 0))
            pause_cpu();
        }
        
      }		
    }					
    else						
    {
      if (threadIndex == 0)
      {	
        for (size_t i=0; i<threadCount; i++)
          count0[i] = 0;
        
        for (size_t i=1; i<threadCount; i++)
        {		
          while (likely(count1[i] == 0))
            pause_cpu();
        }
        
        mode  = 0;
        flag0 = 0;
        __memory_barrier();
        flag1 = 1;
      }			
      else
      {					
        count1[threadIndex] = 1;
        {
          while (likely(flag1 == 0))
            pause_cpu();
        }
      }		
    }					
  }